

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O0

void __thiscall
QGraphicsAnchorLayoutPrivate::findPaths(QGraphicsAnchorLayoutPrivate *this,Orientation orientation)

{
  bool bVar1;
  AnchorVertex **ppAVar2;
  QMultiHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath> *this_00;
  undefined4 in_ESI;
  QMultiHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath> *in_RDI;
  long in_FS_OFFSET;
  QList<QtGraphicsAnchorLayout::AnchorVertex_*> *__range2;
  QList<QtGraphicsAnchorLayout::AnchorVertex_*> *__range1;
  AnchorVertex *v_1;
  const_iterator __end2;
  const_iterator __begin2;
  QList<QtGraphicsAnchorLayout::AnchorVertex_*> adjacentVertices_1;
  GraphPath current;
  AnchorData *edge;
  pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*> pair;
  AnchorVertex *v;
  const_iterator __end1;
  const_iterator __begin1;
  QList<QtGraphicsAnchorLayout::AnchorVertex_*> adjacentVertices;
  AnchorVertex *root;
  QSet<QtGraphicsAnchorLayout::AnchorData_*> visited;
  QQueue<std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>_>
  queue;
  undefined4 in_stack_fffffffffffffe68;
  Orientation in_stack_fffffffffffffe6c;
  GraphPath *in_stack_fffffffffffffe70;
  QMultiHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>
  *in_stack_fffffffffffffe88;
  QSet<QtGraphicsAnchorLayout::AnchorData_*> *visited_00;
  undefined4 in_stack_fffffffffffffe98;
  AnchorVertex *in_stack_fffffffffffffea8;
  AnchorVertex *local_148;
  const_iterator in_stack_fffffffffffffec0;
  const_iterator in_stack_fffffffffffffec8;
  const_iterator local_130;
  QMultiHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath> local_128;
  undefined1 *local_118;
  undefined1 *local_d8;
  undefined1 *local_d0;
  AnchorData *local_b8;
  pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*> local_b0;
  pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*> local_a0;
  AnchorVertex *local_90;
  AnchorVertex **local_88;
  const_iterator local_80;
  const_iterator local_78;
  QSet<QtGraphicsAnchorLayout::AnchorData_*> local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  AnchorVertex *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QQueue<std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>_>
  ::QQueue((QQueue<std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>_>
            *)0x93ed89);
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  QSet<QtGraphicsAnchorLayout::AnchorData_*>::QSet
            ((QSet<QtGraphicsAnchorLayout::AnchorData_*> *)0x93eda5);
  ppAVar2 = QHVContainer<QtGraphicsAnchorLayout::AnchorVertex_*>::operator[]
                      ((QHVContainer<QtGraphicsAnchorLayout::AnchorVertex_*> *)
                       in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
  local_30 = *ppAVar2;
  this_00 = QHVContainer<QMultiHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>_>
            ::operator[]((QHVContainer<QMultiHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>_>
                          *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
  QtGraphicsAnchorLayout::GraphPath::GraphPath(in_stack_fffffffffffffe70);
  QMultiHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>::insert
            (in_RDI,(AnchorVertex **)this_00,in_stack_fffffffffffffe70);
  QtGraphicsAnchorLayout::GraphPath::~GraphPath(in_stack_fffffffffffffe70);
  local_70.q_hash.d = (Hash)&DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  local_60 = &DAT_aaaaaaaaaaaaaaaa;
  QHVContainer<Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>_>::
  operator[]((QHVContainer<Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>_>
              *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
  Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::adjacentVertices
            ((Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData> *)
             this_00,in_stack_fffffffffffffea8);
  visited_00 = &local_70;
  local_78.i = (AnchorVertex **)&DAT_aaaaaaaaaaaaaaaa;
  local_78 = QList<QtGraphicsAnchorLayout::AnchorVertex_*>::begin
                       ((QList<QtGraphicsAnchorLayout::AnchorVertex_*> *)in_stack_fffffffffffffe70);
  local_80.i = (AnchorVertex **)&DAT_aaaaaaaaaaaaaaaa;
  local_80 = QList<QtGraphicsAnchorLayout::AnchorVertex_*>::end
                       ((QList<QtGraphicsAnchorLayout::AnchorVertex_*> *)in_stack_fffffffffffffe70);
  while( true ) {
    local_88 = local_80.i;
    bVar1 = QList<QtGraphicsAnchorLayout::AnchorVertex_*>::const_iterator::operator!=
                      (&local_78,local_80);
    if (!bVar1) break;
    ppAVar2 = QList<QtGraphicsAnchorLayout::AnchorVertex_*>::const_iterator::operator*(&local_78);
    local_90 = *ppAVar2;
    std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>::
    pair<QtGraphicsAnchorLayout::AnchorVertex_*&,_QtGraphicsAnchorLayout::AnchorVertex_*&,_true>
              (&local_a0,&local_30,&local_90);
    QQueue<std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>_>
    ::enqueue((QQueue<std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>_>
               *)in_stack_fffffffffffffe70,
              (pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>
               *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    QList<QtGraphicsAnchorLayout::AnchorVertex_*>::const_iterator::operator++(&local_78);
  }
  while (bVar1 = QList<std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>_>
                 ::isEmpty((QList<std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>_>
                            *)0x93ef69), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_b0.second = (AnchorVertex *)&DAT_aaaaaaaaaaaaaaaa;
    local_b0.first = (AnchorVertex *)&DAT_aaaaaaaaaaaaaaaa;
    local_b0 = QQueue<std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>_>
               ::dequeue((QQueue<std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>_>
                          *)0x93ef9f);
    QHVContainer<Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>_>::
    operator[]((QHVContainer<Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>_>
                *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
    local_b8 = Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::
               edgeData((Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>
                         *)in_stack_fffffffffffffe70,(AnchorVertex *)in_stack_fffffffffffffec8.i,
                        (AnchorVertex *)in_stack_fffffffffffffec0.i);
    bVar1 = QSet<QtGraphicsAnchorLayout::AnchorData_*>::contains
                      (&in_stack_fffffffffffffe70->positives,
                       (AnchorData **)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68))
    ;
    if (!bVar1) {
      QSet<QtGraphicsAnchorLayout::AnchorData_*>::insert
                ((QSet<QtGraphicsAnchorLayout::AnchorData_*> *)in_stack_fffffffffffffe88,
                 (AnchorData **)in_RDI);
      local_d8 = &DAT_aaaaaaaaaaaaaaaa;
      local_d0 = &DAT_aaaaaaaaaaaaaaaa;
      QHVContainer<QMultiHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>_>
      ::operator[]((QHVContainer<QMultiHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>_>
                    *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
      QMultiHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>::value
                (in_stack_fffffffffffffe88,(AnchorVertex **)in_RDI);
      if (local_b8->from == local_b0.first) {
        QSet<QtGraphicsAnchorLayout::AnchorData_*>::insert
                  ((QSet<QtGraphicsAnchorLayout::AnchorData_*> *)in_stack_fffffffffffffe88,
                   (AnchorData **)in_RDI);
      }
      else {
        QSet<QtGraphicsAnchorLayout::AnchorData_*>::insert
                  ((QSet<QtGraphicsAnchorLayout::AnchorData_*> *)in_stack_fffffffffffffe88,
                   (AnchorData **)in_RDI);
      }
      QHVContainer<QMultiHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>_>
      ::operator[]((QHVContainer<QMultiHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>_>
                    *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
      QMultiHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>::insert
                (in_RDI,(AnchorVertex **)this_00,in_stack_fffffffffffffe70);
      local_128.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_128.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_118 = &DAT_aaaaaaaaaaaaaaaa;
      QHVContainer<Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>_>
      ::operator[]((QHVContainer<Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>_>
                    *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
      Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::
      adjacentVertices((Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>
                        *)this_00,in_stack_fffffffffffffea8);
      in_stack_fffffffffffffe88 = &local_128;
      local_130.i = (AnchorVertex **)&DAT_aaaaaaaaaaaaaaaa;
      local_130 = QList<QtGraphicsAnchorLayout::AnchorVertex_*>::begin
                            ((QList<QtGraphicsAnchorLayout::AnchorVertex_*> *)
                             in_stack_fffffffffffffe70);
      in_stack_fffffffffffffec0 =
           QList<QtGraphicsAnchorLayout::AnchorVertex_*>::end
                     ((QList<QtGraphicsAnchorLayout::AnchorVertex_*> *)in_stack_fffffffffffffe70);
      while (in_stack_fffffffffffffec8.i = in_stack_fffffffffffffec0.i,
            bVar1 = QList<QtGraphicsAnchorLayout::AnchorVertex_*>::const_iterator::operator!=
                              (&local_130,in_stack_fffffffffffffec0), bVar1) {
        ppAVar2 = QList<QtGraphicsAnchorLayout::AnchorVertex_*>::const_iterator::operator*
                            (&local_130);
        local_148 = *ppAVar2;
        std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>::
        pair<QtGraphicsAnchorLayout::AnchorVertex_*&,_QtGraphicsAnchorLayout::AnchorVertex_*&,_true>
                  ((pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>
                    *)&stack0xfffffffffffffea8,&local_b0.second,&local_148);
        QQueue<std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>_>
        ::enqueue((QQueue<std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>_>
                   *)in_stack_fffffffffffffe70,
                  (pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>
                   *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
        QList<QtGraphicsAnchorLayout::AnchorVertex_*>::const_iterator::operator++(&local_130);
        in_stack_fffffffffffffec0.i = in_stack_fffffffffffffec8.i;
      }
      QList<QtGraphicsAnchorLayout::AnchorVertex_*>::~QList
                ((QList<QtGraphicsAnchorLayout::AnchorVertex_*> *)0x93f20f);
      QtGraphicsAnchorLayout::GraphPath::~GraphPath(in_stack_fffffffffffffe70);
    }
  }
  identifyFloatItems((QGraphicsAnchorLayoutPrivate *)CONCAT44(in_ESI,in_stack_fffffffffffffe98),
                     visited_00,(Orientation)((ulong)in_stack_fffffffffffffe88 >> 0x20));
  QList<QtGraphicsAnchorLayout::AnchorVertex_*>::~QList
            ((QList<QtGraphicsAnchorLayout::AnchorVertex_*> *)0x93f249);
  QSet<QtGraphicsAnchorLayout::AnchorData_*>::~QSet
            ((QSet<QtGraphicsAnchorLayout::AnchorData_*> *)0x93f253);
  QQueue<std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>_>
  ::~QQueue((QQueue<std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>_>
             *)0x93f260);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsAnchorLayoutPrivate::findPaths(Qt::Orientation orientation)
{
    QQueue<std::pair<AnchorVertex *, AnchorVertex *> > queue;

    QSet<AnchorData *> visited;

    AnchorVertex *root = layoutFirstVertex[orientation];

    graphPaths[orientation].insert(root, GraphPath());

    const auto adjacentVertices = graph[orientation].adjacentVertices(root);
    for (AnchorVertex *v : adjacentVertices)
        queue.enqueue(std::pair(root, v));

    while(!queue.isEmpty()) {
        std::pair<AnchorVertex *, AnchorVertex *>  pair = queue.dequeue();
        AnchorData *edge = graph[orientation].edgeData(pair.first, pair.second);

        if (visited.contains(edge))
            continue;

        visited.insert(edge);
        GraphPath current = graphPaths[orientation].value(pair.first);

        if (edge->from == pair.first)
            current.positives.insert(edge);
        else
            current.negatives.insert(edge);

        graphPaths[orientation].insert(pair.second, current);

        const auto adjacentVertices = graph[orientation].adjacentVertices(pair.second);
        for (AnchorVertex *v : adjacentVertices)
            queue.enqueue(std::pair(pair.second, v));
    }

    // We will walk through every reachable items (non-float) store them in a temporary set.
    // We them create a set of all items and subtract the non-floating items from the set in
    // order to get the floating items. The floating items is then stored in m_floatItems
    identifyFloatItems(visited, orientation);
}